

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::FindExtensionInfoFromTag
          (ExtensionSet *this,uint32 tag,ExtensionFinder *extension_finder,int *field_number,
          ExtensionInfo *extension)

{
  int iVar1;
  WireType WVar2;
  uint uVar3;
  FieldType type;
  WireType WVar4;
  bool local_35;
  WireType expected_wire_type;
  bool is_unknown;
  WireType wire_type;
  ExtensionInfo *extension_local;
  int *field_number_local;
  ExtensionFinder *extension_finder_local;
  uint32 tag_local;
  ExtensionSet *this_local;
  
  iVar1 = WireFormatLite::GetTagFieldNumber(tag);
  *field_number = iVar1;
  WVar2 = WireFormatLite::GetTagWireType(tag);
  uVar3 = (*extension_finder->_vptr_ExtensionFinder[2])
                    (extension_finder,(ulong)(uint)*field_number,extension);
  if ((uVar3 & 1) == 0) {
    local_35 = true;
  }
  else if ((extension->is_packed & 1U) == 0) {
    type = anon_unknown_0::real_type(extension->type);
    WVar4 = WireFormatLite::WireTypeForFieldType(type);
    local_35 = WVar2 != WVar4;
  }
  else {
    local_35 = WVar2 != WIRETYPE_LENGTH_DELIMITED;
  }
  return (bool)((local_35 ^ 0xffU) & 1);
}

Assistant:

bool ExtensionSet::FindExtensionInfoFromTag(
    uint32 tag, ExtensionFinder* extension_finder,
    int* field_number, ExtensionInfo* extension) {
  *field_number = WireFormatLite::GetTagFieldNumber(tag);
  WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

  bool is_unknown;
  if (!extension_finder->Find(*field_number, extension)) {
    is_unknown = true;
  } else if (extension->is_packed) {
    is_unknown = (wire_type != WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
  } else {
    WireFormatLite::WireType expected_wire_type =
        WireFormatLite::WireTypeForFieldType(real_type(extension->type));
    is_unknown = (wire_type != expected_wire_type);
  }
  return !is_unknown;
}